

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::record::IntegerBase<2U,_13U>::verifySize(uint size)

{
  undefined8 *puVar1;
  
  if (size < 0xe) {
    return;
  }
  tools::Log::error<char_const*,unsigned_int>
            ("Too many K values for INTG record with NDIGIT = {}",2);
  tools::Log::info<char_const*,unsigned_int>("Expected at most: {}",0xd);
  tools::Log::info<char_const*,unsigned_int>("Got: {}",size);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( unsigned int size ) {

  if ( size > N ) {

    Log::error( "Too many K values for INTG record with NDIGIT = {}", NDIGIT );
    Log::info( "Expected at most: {}", N );
    Log::info( "Got: {}", size );
    throw std::exception();
  }
}